

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector3d.h
# Opt level: O0

vector3d<float> __thiscall
irr::core::vector3d<float>::rotationToDirection(vector3d<float> *this,vector3d<float> *forwards)

{
  vector3d<float> vVar1;
  float *in_RSI;
  float *in_RDI;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  f64 pseudoMatrix [9];
  f64 crsp;
  f64 srsp;
  f64 sy;
  f64 cy;
  f64 sp;
  f64 cp;
  f64 sr;
  f64 cr;
  vector3d<float> local_c;
  
  dVar2 = cos((double)*in_RDI * 0.017453292519943295);
  dVar3 = sin((double)*in_RDI * 0.017453292519943295);
  dVar4 = cos((double)in_RDI[1] * 0.017453292519943295);
  dVar5 = sin((double)in_RDI[1] * 0.017453292519943295);
  dVar6 = cos((double)in_RDI[2] * 0.017453292519943295);
  dVar7 = sin((double)in_RDI[2] * 0.017453292519943295);
  dVar9 = (double)*in_RSI;
  dVar10 = (double)in_RSI[1];
  dVar8 = (double)in_RSI[2];
  vector3d(&local_c,(float)(dVar8 * (dVar2 * dVar5 * dVar6 + dVar3 * dVar7) +
                           dVar9 * dVar4 * dVar6 + dVar10 * (dVar3 * dVar5 * dVar6 - dVar2 * dVar7))
           ,(float)(dVar8 * (dVar2 * dVar5 * dVar7 - dVar3 * dVar6) +
                   dVar9 * dVar4 * dVar7 + dVar10 * (dVar3 * dVar5 * dVar7 + dVar2 * dVar6)),
           (float)(dVar8 * dVar2 * dVar4 + dVar9 * -dVar5 + dVar10 * dVar3 * dVar4));
  vVar1.Z = local_c.Z;
  vVar1.X = local_c.X;
  vVar1.Y = local_c.Y;
  return vVar1;
}

Assistant:

vector3d<T> rotationToDirection(const vector3d<T> &forwards = vector3d<T>(0, 0, 1)) const
	{
		const f64 cr = cos(core::DEGTORAD64 * X);
		const f64 sr = sin(core::DEGTORAD64 * X);
		const f64 cp = cos(core::DEGTORAD64 * Y);
		const f64 sp = sin(core::DEGTORAD64 * Y);
		const f64 cy = cos(core::DEGTORAD64 * Z);
		const f64 sy = sin(core::DEGTORAD64 * Z);

		const f64 srsp = sr * sp;
		const f64 crsp = cr * sp;

		const f64 pseudoMatrix[] = {
				(cp * cy), (cp * sy), (-sp),
				(srsp * cy - cr * sy), (srsp * sy + cr * cy), (sr * cp),
				(crsp * cy + sr * sy), (crsp * sy - sr * cy), (cr * cp)};

		return vector3d<T>(
				(T)(forwards.X * pseudoMatrix[0] +
						forwards.Y * pseudoMatrix[3] +
						forwards.Z * pseudoMatrix[6]),
				(T)(forwards.X * pseudoMatrix[1] +
						forwards.Y * pseudoMatrix[4] +
						forwards.Z * pseudoMatrix[7]),
				(T)(forwards.X * pseudoMatrix[2] +
						forwards.Y * pseudoMatrix[5] +
						forwards.Z * pseudoMatrix[8]));
	}